

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_get_info_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  uint8_t uVar1;
  short sVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  uint uVar6;
  anon_union_4_2_947300a4_for_v1 aVar7;
  void *pvVar8;
  undefined8 *puVar9;
  ulong uVar10;
  anon_union_4_2_947300a4_for_v1 *paVar11;
  long *plVar12;
  long *plVar13;
  bcf_info_t *pbVar14;
  char *id;
  bcf_fmt_t *pbVar15;
  ulong uVar16;
  int iVar17;
  bcf1_t *b;
  undefined1 *__size;
  bcf_hdr_t *h;
  long lVar18;
  long lVar19;
  size_t __size_00;
  
  uVar6 = bcf_hdr_id2int(hdr,0,tag);
  uVar16 = 0xffffffff;
  if ((((int)uVar6 < 0) || (uVar3 = (hdr->id[0][uVar6].val)->info[1], (~uVar3 & 0xf) == 0)) ||
     (uVar16 = 0xfffffffe, (uVar3 >> 4 & 0xf) != type)) goto switchD_00125048_caseD_4;
  if ((line->unpacked & 4) == 0) {
    bcf_unpack(line,4);
  }
  uVar16 = *(ulong *)&line->field_0x10;
  if ((uVar16 & 0xffff) != 0) {
    pbVar14 = (line->d).info;
    uVar10 = 0;
    do {
      if (pbVar14->key == uVar6) goto LAB_00124f7c;
      uVar10 = uVar10 + 1;
      pbVar14 = pbVar14 + 1;
    } while ((uVar16 & 0xffff) != uVar10);
LAB_00124f80:
    uVar16 = (ulong)((uint)(type == 0) * 3 - 3);
    goto switchD_00125048_caseD_4;
  }
  uVar10 = 0;
LAB_00124f7c:
  if ((uint)uVar10 == ((uint)uVar16 & 0xffff)) goto LAB_00124f80;
  uVar16 = 1;
  if (type == 0) goto switchD_00125048_caseD_4;
  pbVar14 = (line->d).info;
  uVar10 = uVar10 & 0xffffffff;
  uVar6 = pbVar14[uVar10].len;
  b = (bcf1_t *)(long)(int)uVar6;
  if (type == 3) {
    pvVar8 = *dst;
    if (*ndst <= (int)uVar6) {
      __size = (undefined1 *)((long)&b->rid + 1);
      *ndst = (int)__size;
      pvVar8 = realloc(pvVar8,(size_t)__size);
      *dst = pvVar8;
      uVar6 = pbVar14[uVar10].len;
    }
    memcpy(pvVar8,pbVar14[uVar10].vptr,(long)(int)uVar6);
    *(undefined1 *)((long)*dst + (long)pbVar14[uVar10].len) = 0;
    uVar16 = (ulong)(uint)pbVar14[uVar10].len;
    goto switchD_00125048_caseD_4;
  }
  if (*ndst < (int)uVar6) {
    *ndst = uVar6;
    b = (bcf1_t *)((long)b << 2);
    pvVar8 = realloc(*dst,(size_t)b);
    *dst = pvVar8;
    uVar6 = pbVar14[uVar10].len;
  }
  uVar5 = bcf_float_vector_end;
  uVar3 = pbVar14[uVar10].type;
  h = (bcf_hdr_t *)(ulong)uVar3;
  if (uVar6 != 1) {
    plVar12 = (long *)(ulong)(uVar3 - 1);
    plVar13 = plVar12;
    if (uVar3 - 1 < 5) {
      plVar13 = (long *)((long)&switchD_0012507d::switchdataD_00159f7c +
                        (long)(int)(&switchD_0012507d::switchdataD_00159f7c)[(long)plVar12]);
      switch(plVar12) {
      case (long *)0x0:
        if (0 < (int)uVar6) {
          puVar4 = pbVar14[uVar10].vptr;
          pvVar8 = *dst;
          uVar16 = 0;
          do {
            uVar1 = puVar4[uVar16];
            iVar17 = -0x80000000;
            if (uVar1 != 0x80) {
              if (uVar1 == 0x81) break;
              iVar17 = (int)(char)uVar1;
            }
            *(int *)((long)pvVar8 + uVar16 * 4) = iVar17;
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)pbVar14[uVar10].len);
          goto switchD_00125048_caseD_4;
        }
        break;
      case (long *)0x1:
        if (0 < (int)uVar6) {
          puVar4 = pbVar14[uVar10].vptr;
          pvVar8 = *dst;
          uVar16 = 0;
          do {
            sVar2 = *(short *)(puVar4 + uVar16 * 2);
            iVar17 = -0x80000000;
            if (sVar2 != -0x8000) {
              if (sVar2 == -0x7fff) break;
              iVar17 = (int)sVar2;
            }
            *(int *)((long)pvVar8 + uVar16 * 4) = iVar17;
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)pbVar14[uVar10].len);
          goto switchD_00125048_caseD_4;
        }
        break;
      case (long *)0x2:
        if (0 < (int)uVar6) {
          puVar4 = pbVar14[uVar10].vptr;
          pvVar8 = *dst;
          uVar16 = 0;
          do {
            if (*(int *)(puVar4 + uVar16 * 4) == -0x7fffffff) break;
            *(int *)((long)pvVar8 + uVar16 * 4) = *(int *)(puVar4 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)pbVar14[uVar10].len);
          goto switchD_00125048_caseD_4;
        }
        break;
      case (long *)0x3:
        goto switchD_0012507d_caseD_3;
      case (long *)0x4:
        if (0 < (int)uVar6) {
          puVar4 = pbVar14[uVar10].vptr;
          pvVar8 = *dst;
          uVar10 = 0;
          do {
            uVar16 = uVar10;
            if (uVar5 == *(uint32_t *)(puVar4 + uVar10 * 4)) break;
            *(uint32_t *)((long)pvVar8 + uVar10 * 4) = *(uint32_t *)(puVar4 + uVar10 * 4);
            uVar10 = uVar10 + 1;
            uVar16 = (ulong)uVar6;
          } while (uVar6 != uVar10);
          goto switchD_00125048_caseD_4;
        }
      }
      uVar16 = 0;
      goto switchD_00125048_caseD_4;
    }
switchD_0012507d_caseD_3:
    bcf_get_info_values_cold_1();
    uVar6 = bcf_hdr_id2int(h,0,id);
    __size_00 = 0xffffffff;
    if ((((int)uVar6 < 0) || (uVar3 = (h->id[0][uVar6].val)->info[2], (~uVar3 & 0xf) == 0)) ||
       (__size_00 = 0xfffffffe, (uVar3 & 0xf0) != 0x30)) goto LAB_0012532c;
    if ((b->unpacked & 8) == 0) {
      bcf_unpack(b,8);
    }
    uVar16 = *(ulong *)&b->field_0x10;
    if ((uVar16 & 0xff00000000) != 0) {
      pbVar15 = (b->d).fmt;
      uVar10 = 0;
      do {
        if (pbVar15->id == uVar6) goto LAB_0012526a;
        uVar10 = uVar10 + 1;
        pbVar15 = pbVar15 + 1;
      } while ((uVar16 >> 0x20 & 0xff) != uVar10);
      __size_00 = 0xfffffffd;
      goto LAB_0012532c;
    }
    uVar10 = 0;
LAB_0012526a:
    __size_00 = 0xfffffffd;
    if ((uint)uVar10 == ((uint)(uVar16 >> 0x20) & 0xff)) goto LAB_0012532c;
    uVar10 = uVar10 & 0xffffffff;
    pbVar15 = (b->d).fmt;
    iVar17 = h->n[2];
    lVar18 = (long)iVar17;
    puVar9 = (undefined8 *)*plVar13;
    if (puVar9 == (undefined8 *)0x0) {
      puVar9 = (undefined8 *)malloc(lVar18 * 8);
      *plVar13 = (long)puVar9;
      if (puVar9 != (undefined8 *)0x0) {
        *puVar9 = 0;
        goto LAB_001252ae;
      }
LAB_00125326:
      __size_00 = 0xfffffffc;
    }
    else {
LAB_001252ae:
      __size_00 = ((long)pbVar15[uVar10].n + 1) * lVar18;
      if (*ndst < (int)__size_00) {
        pvVar8 = realloc((void *)*puVar9,__size_00);
        *(void **)*plVar13 = pvVar8;
        if (*(long *)*plVar13 == 0) goto LAB_00125326;
        *ndst = (int)__size_00;
      }
      if (0 < iVar17) {
        lVar19 = 0;
        do {
          iVar17 = pbVar15[uVar10].n;
          pvVar8 = (void *)((long)((iVar17 + 1) * (int)lVar19) + *(long *)*plVar13);
          memcpy(pvVar8,pbVar15[uVar10].p + iVar17 * (int)lVar19,(long)iVar17);
          *(undefined1 *)((long)pbVar15[uVar10].n + (long)pvVar8) = 0;
          *(void **)(*plVar13 + lVar19 * 8) = pvVar8;
          lVar19 = lVar19 + 1;
        } while (lVar18 != lVar19);
      }
    }
LAB_0012532c:
    return (int)__size_00;
  }
  switch(uVar3) {
  case 1:
    aVar7 = (anon_union_4_2_947300a4_for_v1)pbVar14[uVar10].v1.i;
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)*dst;
    if (aVar7.i == -0x80) {
LAB_00125181:
      paVar11->i = -0x80000000;
      goto switchD_00125048_caseD_4;
    }
    break;
  case 2:
    aVar7 = (anon_union_4_2_947300a4_for_v1)pbVar14[uVar10].v1.i;
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)*dst;
    if (aVar7.i == -0x8000) goto LAB_00125181;
    break;
  case 3:
    aVar7 = pbVar14[uVar10].v1;
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)*dst;
    break;
  default:
    goto switchD_00125048_caseD_4;
  case 5:
    *(anon_union_4_2_947300a4_for_v1 *)*dst = pbVar14[uVar10].v1;
    goto switchD_00125048_caseD_4;
  }
  *paVar11 = aVar7;
switchD_00125048_caseD_4:
  return (int)uVar16;
}

Assistant:

int bcf_get_info_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,tag_id) ) return -1;    // no such INFO field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_INFO,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( line->d.info[i].key==tag_id ) break;
    if ( i==line->n_info ) return ( type==BCF_HT_FLAG ) ? 0 : -3;       // the tag is not present in this record
    if ( type==BCF_HT_FLAG ) return 1;

    bcf_info_t *info = &line->d.info[i];
    if ( type==BCF_HT_STR )
    {
        if ( *ndst < info->len+1 )
        {
            *ndst = info->len + 1;
            *dst  = realloc(*dst, *ndst);
        }
        memcpy(*dst,info->vptr,info->len);
        ((uint8_t*)*dst)[info->len] = 0;
        return info->len;
    }

    // Make sure the buffer is big enough
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < info->len )
    {
        *ndst = info->len;
        *dst  = realloc(*dst, *ndst * size1);
    }

    if ( info->len == 1 )
    {
        if ( info->type==BCF_BT_FLOAT ) *((float*)*dst) = info->v1.f;
        else 
        {
            #define BRANCH(type_t, missing) { \
                if ( info->v1.i==missing ) *((int32_t*)*dst) = bcf_int32_missing; \
                else *((int32_t*)*dst) = info->v1.i; \
            }
            switch (info->type)
            {
                case BCF_BT_INT8:  BRANCH(int8_t,  bcf_int8_missing ); break;
                case BCF_BT_INT16: BRANCH(int16_t, bcf_int16_missing); break;
                case BCF_BT_INT32: BRANCH(int32_t, bcf_int32_missing); break;
            }
            #undef BRANCH
        }
        return 1;
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t *) info->vptr; \
        for (j=0; j<info->len; j++) \
        { \
            if ( is_vector_end ) return j; \
            if ( is_missing ) set_missing; \
            else *tmp = p[j]; \
            tmp++; \
        } \
        return j; \
    }
    switch (info->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. info->type=%d\n", __FILE__,__LINE__, info->type); exit(1);
    }
    #undef BRANCH
    return -4;  // this can never happen
}